

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

rc_size __thiscall
baryonyx::itm::
solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  rc_data *prVar4;
  ulong uVar5;
  rc_size rVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined8 in_XMM3_Qb;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  rVar6.r_size = 0;
  rVar6.c_size = 0;
  if (begin != end) {
    uVar7 = 0;
    do {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
      if ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl ==
          (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
          local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        dVar12 = 0.0;
        dVar10 = 0.0;
      }
      else {
        auVar11 = ZEXT816(0);
        auVar9 = ZEXT816(0);
        do {
          uVar3 = *local_38._M_head_impl;
          uVar8 = uVar3 + 0x3f;
          if (-1 < (int)uVar3) {
            uVar8 = uVar3;
          }
          auVar13._0_8_ =
               (double)value_bit_array<-1,_1>::return_value
                       [(uint)((this->A).super_bit_array_impl.m_data._M_t.
                               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                               .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl
                               [(int)uVar8 >> 6] >> ((ulong)uVar3 & 0x3f)) & 1];
          auVar13._8_8_ = in_XMM3_Qb;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (this->pi)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl
                         [(int)*(uint *)((long)local_38._M_head_impl + 4)];
          auVar9 = vfmadd231sd_fma(auVar9,auVar13,auVar1);
          dVar12 = auVar9._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (this->P)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl[(int)uVar3];
          auVar11 = vfmadd231sd_fma(auVar11,auVar13,auVar2);
          dVar10 = auVar11._0_8_;
          local_38._M_head_impl = local_38._M_head_impl + 8;
        } while ((tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
                 (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
                 local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl);
      }
      prVar4 = (this->R)._M_t.
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      prVar4[uVar7].id = (int)uVar7;
      dVar10 = ((this->c->linear_elements)._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl[begin->column] - dVar12) -
               dVar10;
      prVar4[uVar7].value = dVar10;
      uVar3 = begin->value;
      uVar8 = uVar3 + 0x3f;
      if (-1 < (int)uVar3) {
        uVar8 = uVar3;
      }
      uVar5 = (this->A).super_bit_array_impl.m_data._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[(int)uVar8 >> 6];
      prVar4[uVar7].f =
           value_bit_array<-1,_1>::return_value[(uint)(uVar5 >> ((ulong)uVar3 & 0x3f)) & 1];
      if ((uVar5 >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar10;
        auVar9 = vxorpd_avx512vl(auVar11,auVar9);
        dVar10 = (double)vmovlpd_avx(auVar9);
        prVar4[uVar7].value = dVar10;
        rVar6.r_size = rVar6.r_size + 1;
        rVar6.c_size = 0;
      }
      uVar7 = uVar7 + 1;
      begin = begin + 1;
    } while (begin != end);
    rVar6 = (rc_size)((long)rVar6 << 0x20 | uVar7 & 0xffffffff);
  }
  return rVar6;
}

Assistant:

rc_size compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                                  sparse_matrix<int>::row_iterator end,
                                  const Xtype& x) noexcept
    {
        int r_size = 0;
        int c_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                auto a = static_cast<Float>(A.get(std::get<0>(ht)->value));

                sum_a_pi += a * pi[std::get<0>(ht)->row];
                sum_a_p += a * P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;
            R[r_size].f = A.get(begin->value);

            if (R[r_size].is_negative_factor()) {
                R[r_size].value = -R[r_size].value;
                ++c_size;
            }

            ++r_size;
        }

        return { r_size, c_size };
    }